

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_uncompress_lzma(backtrace_state *state,uchar *compressed,size_t compressed_size,
                       backtrace_error_callback error_callback,void *data,uchar **uncompressed,
                       size_t *uncompressed_size)

{
  int iVar1;
  uchar *uncompressed_00;
  uint16_t *probs_00;
  bool bVar2;
  size_t compressed_block_size;
  uint16_t *probs;
  uchar *mem;
  uint64_t index_uncompressed_size;
  uint64_t index_compressed_size;
  size_t index_offset;
  size_t footer_offset;
  size_t index_size;
  size_t offset;
  uint32_t local_58;
  uint32_t stream_crc;
  uint32_t computed_crc;
  uchar check;
  size_t footer_size;
  size_t header_size;
  uchar **uncompressed_local;
  void *data_local;
  backtrace_error_callback error_callback_local;
  size_t compressed_size_local;
  uchar *compressed_local;
  backtrace_state *state_local;
  
  footer_size = 0xc;
  _computed_crc = 0xc;
  header_size = (size_t)uncompressed;
  uncompressed_local = (uchar **)data;
  data_local = error_callback;
  error_callback_local = (backtrace_error_callback)compressed_size;
  compressed_size_local = (size_t)compressed;
  compressed_local = (uchar *)state;
  if (compressed_size < 0x18) {
    elf_uncompress_failed();
    state_local._4_4_ = 0;
  }
  else {
    iVar1 = memcmp(compressed,anon_var_dwarf_64976,6);
    if (iVar1 == 0) {
      if (*(char *)(compressed_size_local + 6) == '\0') {
        stream_crc._3_1_ = *(byte *)(compressed_size_local + 7);
        if ((stream_crc._3_1_ & 0xf8) == 0) {
          local_58 = elf_crc32(0,(uchar *)(compressed_size_local + 6),2);
          offset._4_4_ = *(uint32_t *)(compressed_size_local + 8);
          if (local_58 == offset._4_4_) {
            index_size = (size_t)error_callback_local;
            if (*(short *)(error_callback_local + (compressed_size_local - 2)) == 0x5a59) {
              index_size = (size_t)(error_callback_local + -2);
              bVar2 = true;
              if (error_callback_local[compressed_size_local - 4] ==
                  (_func_void_void_ptr_char_ptr_int)0x0) {
                bVar2 = error_callback_local[compressed_size_local - 3] !=
                        (_func_void_void_ptr_char_ptr_int)stream_crc._3_1_;
              }
              if (bVar2) {
                elf_uncompress_failed();
                state_local._4_4_ = 0;
              }
              else {
                footer_offset =
                     ((long)CONCAT13(error_callback_local[compressed_size_local - 5],
                                     CONCAT12(error_callback_local[compressed_size_local - 6],
                                              CONCAT11(error_callback_local
                                                       [compressed_size_local - 7],
                                                       error_callback_local
                                                       [compressed_size_local - 8]))) + 1) * 4;
                index_size = (size_t)(error_callback_local + -8);
                local_58 = elf_crc32(0,(uchar *)(index_size + compressed_size_local),6);
                offset._4_4_ = CONCAT13(*(undefined1 *)(compressed_size_local + (index_size - 1)),
                                        CONCAT12(*(undefined1 *)
                                                  (compressed_size_local + (index_size - 2)),
                                                 CONCAT11(*(undefined1 *)
                                                           (compressed_size_local + (index_size - 3)
                                                           ),*(undefined1 *)
                                                              (compressed_size_local +
                                                              (index_size - 4)))));
                if (local_58 == offset._4_4_) {
                  index_offset = index_size - 4;
                  if (index_offset < footer_offset + footer_size) {
                    index_size = index_offset;
                    elf_uncompress_failed();
                    state_local._4_4_ = 0;
                  }
                  else {
                    index_compressed_size = index_offset - footer_offset;
                    if (*(char *)(compressed_size_local + index_compressed_size) == '\0') {
                      index_size = index_compressed_size + 1;
                      if (*(char *)(compressed_size_local + index_size) == '\0') {
                        *(undefined8 *)header_size = 0;
                        *uncompressed_size = 0;
                        state_local._4_4_ = 1;
                      }
                      else if (*(char *)(compressed_size_local + index_size) == '\x01') {
                        index_size = index_compressed_size + 2;
                        iVar1 = elf_lzma_varint((uchar *)compressed_size_local,
                                                (size_t)error_callback_local,&index_size,
                                                &index_uncompressed_size);
                        if (iVar1 == 0) {
                          state_local._4_4_ = 0;
                        }
                        else {
                          iVar1 = elf_lzma_varint((uchar *)compressed_size_local,
                                                  (size_t)error_callback_local,&index_size,
                                                  (uint64_t *)&mem);
                          if (iVar1 == 0) {
                            state_local._4_4_ = 0;
                          }
                          else {
                            index_size = index_size + 3 & 0xfffffffffffffffc;
                            local_58 = elf_crc32(0,(uchar *)(compressed_size_local +
                                                            index_compressed_size),
                                                 index_size - index_compressed_size);
                            offset._4_4_ = CONCAT13(*(undefined1 *)
                                                     (compressed_size_local + 3 + index_size),
                                                    CONCAT12(*(undefined1 *)
                                                              (compressed_size_local + 2 +
                                                              index_size),
                                                             CONCAT11(*(undefined1 *)
                                                                       (compressed_size_local + 1 +
                                                                       index_size),
                                                                      *(undefined1 *)
                                                                       (compressed_size_local +
                                                                       index_size))));
                            if (local_58 == offset._4_4_) {
                              index_size = index_size + 4;
                              if (index_size == index_offset) {
                                uncompressed_00 =
                                     (uchar *)tcmalloc_backtrace_alloc
                                                        ((backtrace_state *)compressed_local,
                                                         (size_t)mem,
                                                         (backtrace_error_callback)data_local,
                                                         uncompressed_local);
                                if (uncompressed_00 == (uchar *)0x0) {
                                  state_local._4_4_ = 0;
                                }
                                else {
                                  *(uchar **)header_size = uncompressed_00;
                                  *uncompressed_size = (size_t)mem;
                                  probs_00 = (uint16_t *)
                                             tcmalloc_backtrace_alloc
                                                       ((backtrace_state *)compressed_local,0x6e6c,
                                                        (backtrace_error_callback)data_local,
                                                        uncompressed_local);
                                  if (probs_00 == (uint16_t *)0x0) {
                                    tcmalloc_backtrace_free
                                              ((backtrace_state *)compressed_local,uncompressed_00,
                                               (size_t)mem,(backtrace_error_callback)data_local,
                                               uncompressed_local);
                                    state_local._4_4_ = 0;
                                  }
                                  else {
                                    index_size = 0xc;
                                    iVar1 = elf_uncompress_lzma_block
                                                      ((uchar *)compressed_size_local,
                                                       (size_t)error_callback_local,stream_crc._3_1_
                                                       ,probs_00,uncompressed_00,(size_t)mem,
                                                       &index_size);
                                    if (iVar1 == 0) {
                                      tcmalloc_backtrace_free
                                                ((backtrace_state *)compressed_local,uncompressed_00
                                                 ,(size_t)mem,(backtrace_error_callback)data_local,
                                                 uncompressed_local);
                                      state_local._4_4_ = 0;
                                    }
                                    else if (index_size - 0xc ==
                                             (index_uncompressed_size + 3 & 0xfffffffffffffffc)) {
                                      index_size = index_size + 3 & 0xfffffffffffffffc;
                                      if (index_size == index_compressed_size) {
                                        state_local._4_4_ = 1;
                                      }
                                      else {
                                        elf_uncompress_failed();
                                        tcmalloc_backtrace_free
                                                  ((backtrace_state *)compressed_local,
                                                   uncompressed_00,(size_t)mem,
                                                   (backtrace_error_callback)data_local,
                                                   uncompressed_local);
                                        state_local._4_4_ = 0;
                                      }
                                    }
                                    else {
                                      elf_uncompress_failed();
                                      tcmalloc_backtrace_free
                                                ((backtrace_state *)compressed_local,uncompressed_00
                                                 ,(size_t)mem,(backtrace_error_callback)data_local,
                                                 uncompressed_local);
                                      state_local._4_4_ = 0;
                                    }
                                  }
                                }
                              }
                              else {
                                elf_uncompress_failed();
                                state_local._4_4_ = 0;
                              }
                            }
                            else {
                              elf_uncompress_failed();
                              state_local._4_4_ = 0;
                            }
                          }
                        }
                      }
                      else {
                        elf_uncompress_failed();
                        state_local._4_4_ = 0;
                      }
                    }
                    else {
                      index_size = index_compressed_size;
                      elf_uncompress_failed();
                      state_local._4_4_ = 0;
                    }
                  }
                }
                else {
                  elf_uncompress_failed();
                  state_local._4_4_ = 0;
                }
              }
            }
            else {
              elf_uncompress_failed();
              state_local._4_4_ = 0;
            }
          }
          else {
            elf_uncompress_failed();
            state_local._4_4_ = 0;
          }
        }
        else {
          elf_uncompress_failed();
          state_local._4_4_ = 0;
        }
      }
      else {
        elf_uncompress_failed();
        state_local._4_4_ = 0;
      }
    }
    else {
      elf_uncompress_failed();
      state_local._4_4_ = 0;
    }
  }
  return state_local._4_4_;
}

Assistant:

static int
elf_uncompress_lzma (struct backtrace_state *state,
		     const unsigned char *compressed, size_t compressed_size,
		     backtrace_error_callback error_callback, void *data,
		     unsigned char **uncompressed, size_t *uncompressed_size)
{
  size_t header_size;
  size_t footer_size;
  unsigned char check;
  uint32_t computed_crc;
  uint32_t stream_crc;
  size_t offset;
  size_t index_size;
  size_t footer_offset;
  size_t index_offset;
  uint64_t index_compressed_size;
  uint64_t index_uncompressed_size;
  unsigned char *mem;
  uint16_t *probs;
  size_t compressed_block_size;

  /* The format starts with a stream header and ends with a stream
     footer.  */
  header_size = 12;
  footer_size = 12;
  if (unlikely (compressed_size < header_size + footer_size))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* The stream header starts with a magic string.  */
  if (unlikely (memcmp (compressed, "\375" "7zXZ\0", 6) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Next come stream flags.  The first byte is zero, the second byte
     is the check.  */
  if (unlikely (compressed[6] != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  check = compressed[7];
  if (unlikely ((check & 0xf8) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Next comes a CRC of the stream flags.  */
  computed_crc = elf_crc32 (0, compressed + 6, 2);
  stream_crc = ((uint32_t)compressed[8]
		| ((uint32_t)compressed[9] << 8)
		| ((uint32_t)compressed[10] << 16)
		| ((uint32_t)compressed[11] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Now that we've parsed the header, parse the footer, so that we
     can get the uncompressed size.  */

  /* The footer ends with two magic bytes.  */

  offset = compressed_size;
  if (unlikely (memcmp (compressed + offset - 2, "YZ", 2) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 2;

  /* Before that are the stream flags, which should be the same as the
     flags in the header.  */
  if (unlikely (compressed[offset - 2] != 0
		|| compressed[offset - 1] != check))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 2;

  /* Before that is the size of the index field, which precedes the
     footer.  */
  index_size = (compressed[offset - 4]
		| (compressed[offset - 3] << 8)
		| (compressed[offset - 2] << 16)
		| (compressed[offset - 1] << 24));
  index_size = (index_size + 1) * 4;
  offset -= 4;

  /* Before that is a footer CRC.  */
  computed_crc = elf_crc32 (0, compressed + offset, 6);
  stream_crc = ((uint32_t)compressed[offset - 4]
		| ((uint32_t)compressed[offset - 3] << 8)
		| ((uint32_t)compressed[offset - 2] << 16)
		| ((uint32_t)compressed[offset - 1] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 4;

  /* The index comes just before the footer.  */
  if (unlikely (offset < index_size + header_size))
    {
      elf_uncompress_failed ();
      return 0;
    }

  footer_offset = offset;
  offset -= index_size;
  index_offset = offset;

  /* The index starts with a zero byte.  */
  if (unlikely (compressed[offset] != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  ++offset;

  /* Next is the number of blocks.  We expect zero blocks for an empty
     stream, and otherwise a single block.  */
  if (unlikely (compressed[offset] == 0))
    {
      *uncompressed = NULL;
      *uncompressed_size = 0;
      return 1;
    }
  if (unlikely (compressed[offset] != 1))
    {
      elf_uncompress_failed ();
      return 0;
    }
  ++offset;

  /* Next is the compressed size and the uncompressed size.  */
  if (!elf_lzma_varint (compressed, compressed_size, &offset,
			&index_compressed_size))
    return 0;
  if (!elf_lzma_varint (compressed, compressed_size, &offset,
			&index_uncompressed_size))
    return 0;

  /* Pad to a four byte boundary.  */
  offset = (offset + 3) &~ (size_t) 3;

  /* Next is a CRC of the index.  */
  computed_crc = elf_crc32 (0, compressed + index_offset,
			    offset - index_offset);
  stream_crc = ((uint32_t)compressed[offset]
		| ((uint32_t)compressed[offset + 1] << 8)
		| ((uint32_t)compressed[offset + 2] << 16)
		| ((uint32_t)compressed[offset + 3] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset += 4;

  /* We should now be back at the footer.  */
  if (unlikely (offset != footer_offset))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Allocate space to hold the uncompressed data.  If we succeed in
     uncompressing the LZMA data, we never free this memory.  */
  mem = (unsigned char *) backtrace_alloc (state, index_uncompressed_size,
					   error_callback, data);
  if (unlikely (mem == NULL))
    return 0;
  *uncompressed = mem;
  *uncompressed_size = index_uncompressed_size;

  /* Allocate space for probabilities.  */
  probs = ((uint16_t *)
	   backtrace_alloc (state,
			    LZMA_PROB_TOTAL_COUNT * sizeof (uint16_t),
			    error_callback, data));
  if (unlikely (probs == NULL))
    {
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  /* Uncompress the block, which follows the header.  */
  offset = 12;
  if (!elf_uncompress_lzma_block (compressed, compressed_size, check, probs,
				  mem, index_uncompressed_size, &offset))
    {
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  compressed_block_size = offset - 12;
  if (unlikely (compressed_block_size
		!= ((index_compressed_size + 3) &~ (size_t) 3)))
    {
      elf_uncompress_failed ();
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  offset = (offset + 3) &~ (size_t) 3;
  if (unlikely (offset != index_offset))
    {
      elf_uncompress_failed ();
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  return 1;
}